

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

glist_t fsg_model_null_trans_closure(fsg_model_t *fsg,glist_t nulls)

{
  hash_table_t *h;
  int32 *piVar1;
  void *pvVar2;
  bool bVar3;
  int32 iVar4;
  fsg_link_t *ptr;
  hash_iter_t *local_60;
  hash_iter_t *itor_1;
  hash_table_t *null_trans;
  hash_iter_t *itor;
  uint local_40;
  int i;
  int32 n;
  int32 k;
  fsg_link_t *tl2;
  fsg_link_t *tl1;
  gnode_s *pgStack_20;
  int updated;
  gnode_t *gn1;
  glist_t nulls_local;
  fsg_model_t *fsg_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0xbe,"Computing transitive closure for null transitions\n");
  gn1 = nulls;
  if (nulls == (glist_t)0x0) {
    for (itor._4_4_ = 0; itor._4_4_ < fsg->n_state; itor._4_4_ = itor._4_4_ + 1) {
      h = fsg->trans[itor._4_4_].null_trans;
      if (h != (hash_table_t *)0x0) {
        for (null_trans = (hash_table_t *)hash_table_iter(h); null_trans != (hash_table_t *)0x0;
            null_trans = (hash_table_t *)hash_table_iter_next((hash_iter_t *)null_trans)) {
          gn1 = glist_add_ptr(gn1,*(void **)(*(long *)&null_trans->size + 0x10));
        }
      }
    }
  }
  local_40 = 0;
  do {
    bVar3 = false;
    for (pgStack_20 = gn1; pgStack_20 != (gnode_t *)0x0; pgStack_20 = pgStack_20->next) {
      piVar1 = (int32 *)(pgStack_20->data).ptr;
      if (-1 < piVar1[3]) {
        __assert_fail("tl1->wid < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0xde,"glist_t fsg_model_null_trans_closure(fsg_model_t *, glist_t)");
      }
      if (fsg->trans[piVar1[1]].null_trans != (hash_table_t *)0x0) {
        for (local_60 = hash_table_iter(fsg->trans[piVar1[1]].null_trans);
            local_60 != (hash_iter_t *)0x0; local_60 = hash_table_iter_next(local_60)) {
          pvVar2 = local_60->ent->val;
          iVar4 = fsg_model_null_trans_add
                            (fsg,*piVar1,*(int32 *)((long)pvVar2 + 4),
                             piVar1[2] + *(int *)((long)pvVar2 + 8));
          if ((-1 < iVar4) && (bVar3 = true, 0 < iVar4)) {
            ptr = fsg_model_null_trans(fsg,*piVar1,*(int32 *)((long)pvVar2 + 4));
            gn1 = glist_add_ptr(gn1,ptr);
            local_40 = local_40 + 1;
          }
        }
      }
    }
  } while (bVar3);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0xfc,"%d null transitions added\n",(ulong)local_40);
  return gn1;
}

Assistant:

glist_t
fsg_model_null_trans_closure(fsg_model_t * fsg, glist_t nulls)
{
    gnode_t *gn1;
    int updated;
    fsg_link_t *tl1, *tl2;
    int32 k, n;

    E_INFO("Computing transitive closure for null transitions\n");

    /* If our caller didn't give us a list of null-transitions,
       make such a list. Just loop through all the FSG states, 
       and all the null-transitions in that state (which are kept in
       their own hash table). */
    if (nulls == NULL) {
        int i;
        for (i = 0; i < fsg->n_state; ++i) {
            hash_iter_t *itor;
            hash_table_t *null_trans = fsg->trans[i].null_trans;
            if (null_trans == NULL)
                continue;
            for (itor = hash_table_iter(null_trans);
                 itor != NULL; itor = hash_table_iter_next(itor)) {
                nulls = glist_add_ptr(nulls, hash_entry_val(itor->ent));
            }
        }
    }

    /*
     * Probably not the most efficient closure implementation, in general, but
     * probably reasonably efficient for a sparse null transition matrix.
     */
    n = 0;
    do {
        updated = FALSE;

        for (gn1 = nulls; gn1; gn1 = gnode_next(gn1)) {
            hash_iter_t *itor;

            tl1 = (fsg_link_t *) gnode_ptr(gn1);
            assert(tl1->wid < 0);

            if (fsg->trans[tl1->to_state].null_trans == NULL)
                continue;

            for (itor =
                 hash_table_iter(fsg->trans[tl1->to_state].null_trans);
                 itor; itor = hash_table_iter_next(itor)) {

                tl2 = (fsg_link_t *) hash_entry_val(itor->ent);

                k = fsg_model_null_trans_add(fsg,
                                             tl1->from_state,
                                             tl2->to_state,
                                             tl1->logs2prob +
                                             tl2->logs2prob);
                if (k >= 0) {
                    updated = TRUE;
                    if (k > 0) {
                        nulls = glist_add_ptr(nulls, (void *)
                                              fsg_model_null_trans
                                              (fsg, tl1->from_state,
                                               tl2->to_state));
                        n++;
                    }
                }
            }
        }
    } while (updated);

    E_INFO("%d null transitions added\n", n);

    return nulls;
}